

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O3

void __thiscall CLParserTestFilterInputFilename::Run(CLParserTestFilterInputFilename *this)

{
  Test *pTVar1;
  bool bVar2;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pTVar1 = g_current_test;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"foobar.cc","");
  bVar2 = CLParser::FilterInputFilename(&local_48);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                     ,0x27,"CLParser::FilterInputFilename(\"foobar.cc\")");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pTVar1 = g_current_test;
  if (bVar2) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"foo bar.cc","");
    bVar2 = CLParser::FilterInputFilename(&local_68);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                       ,0x28,"CLParser::FilterInputFilename(\"foo bar.cc\")");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    pTVar1 = g_current_test;
    if (bVar2) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"baz.c","");
      bVar2 = CLParser::FilterInputFilename(&local_88);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                         ,0x29,"CLParser::FilterInputFilename(\"baz.c\")");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      pTVar1 = g_current_test;
      if (bVar2) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"FOOBAR.CC","");
        bVar2 = CLParser::FilterInputFilename(&local_a8);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                           ,0x2a,"CLParser::FilterInputFilename(\"FOOBAR.CC\")");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        pTVar1 = g_current_test;
        if (bVar2) {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,
                     "src\\cl_helper.cc(166) : fatal error C1075: end of file found ...","");
          bVar2 = CLParser::FilterInputFilename(&local_c8);
          bVar2 = testing::Test::Check
                            (pTVar1,!bVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                             ,0x2e,
                             "CLParser::FilterInputFilename( \"src\\\\cl_helper.cc(166) : fatal error C1075: end \" \"of file found ...\")"
                            );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if (bVar2) {
            return;
          }
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST(CLParserTest, FilterInputFilename) {
  ASSERT_TRUE(CLParser::FilterInputFilename("foobar.cc"));
  ASSERT_TRUE(CLParser::FilterInputFilename("foo bar.cc"));
  ASSERT_TRUE(CLParser::FilterInputFilename("baz.c"));
  ASSERT_TRUE(CLParser::FilterInputFilename("FOOBAR.CC"));

  ASSERT_FALSE(CLParser::FilterInputFilename(
                   "src\\cl_helper.cc(166) : fatal error C1075: end "
                   "of file found ..."));
}